

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

void __thiscall
vkt::synchronization::anon_unknown_0::IndirectBuffer::GraphicsPipeline::recordCommands
          (GraphicsPipeline *this,OperationContext *context,VkCommandBuffer cmdBuffer,
          VkDescriptorSet descriptorSet)

{
  DeviceInterface *vk;
  long lVar1;
  VkDescriptorSet descriptorSet_local;
  VkBuffer vertexBuffer;
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  
  vk = context->m_vk;
  descriptorSet_local = descriptorSet;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)(((this->m_colorAttachmentImage).
                        super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                        .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,this->m_colorImageSubresourceRange);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,cmdBuffer,1,0x80,0,0,0,0,0,1,(int)&colorAttachmentLayoutBarrier);
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = *(void **)&this->m_colorImageExtent;
  vertexBuffer.m_internal = 0;
  beginRenderPass(vk,cmdBuffer,
                  (VkRenderPass)
                  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                  m_internal,
                  (VkFramebuffer)
                  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object
                  .m_internal,(VkRect2D *)&colorAttachmentLayoutBarrier,(Vec4 *)&vertexBuffer);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,cmdBuffer,0,
             (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
             m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,cmdBuffer,0,
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal,0,1,&descriptorSet_local,0,0);
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  vertexBuffer.m_internal =
       (((this->m_vertices).m_vertexBuffer.
         super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
         .m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
       m_internal;
  (*vk->_vptr_DeviceInterface[0x58])(vk,cmdBuffer,0,1,&vertexBuffer,&colorAttachmentLayoutBarrier);
  if (this->m_resourceType == RESOURCE_TYPE_INDIRECT_BUFFER_DRAW) {
    lVar1 = 0x2d8;
  }
  else {
    if (this->m_resourceType != RESOURCE_TYPE_INDIRECT_BUFFER_DRAW_INDEXED) goto LAB_007616c6;
    (*vk->_vptr_DeviceInterface[0x57])
              (vk,cmdBuffer,
               (deUint64)
               (((this->m_vertices).m_indexBuffer.
                 super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                 .m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object
               ,0,1);
    lVar1 = 0x2e0;
  }
  (**(code **)((long)vk->_vptr_DeviceInterface + lVar1))
            (vk,cmdBuffer,(this->m_indirectBuffer).m_internal,0,1,0);
LAB_007616c6:
  endRenderPass(vk,cmdBuffer);
  return;
}

Assistant:

void recordCommands (OperationContext& context, const VkCommandBuffer cmdBuffer, const VkDescriptorSet descriptorSet)
	{
		const DeviceInterface&	vk	= context.getDeviceInterface();

		// Change color attachment image layout
		{
			const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
				(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
				VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
				**m_colorAttachmentImage, m_colorImageSubresourceRange);

			vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
		}

		{
			const VkRect2D renderArea = {
				makeOffset2D(0, 0),
				makeExtent2D(m_colorImageExtent.width, m_colorImageExtent.height),
			};
			const tcu::Vec4 clearColor = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);

			beginRenderPass(vk, cmdBuffer, *m_renderPass, *m_framebuffer, renderArea, clearColor);
		}

		vk.cmdBindPipeline(cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
		vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
		{
			const VkDeviceSize	vertexBufferOffset	= 0ull;
			const VkBuffer		vertexBuffer		= m_vertices.getVertexBuffer();
			vk.cmdBindVertexBuffers(cmdBuffer, 0u, 1u, &vertexBuffer, &vertexBufferOffset);
		}

		switch (m_resourceType)
		{
			case RESOURCE_TYPE_INDIRECT_BUFFER_DRAW:
				vk.cmdDrawIndirect(cmdBuffer, m_indirectBuffer, 0u, 1u, 0u);
				break;

			case RESOURCE_TYPE_INDIRECT_BUFFER_DRAW_INDEXED:
				vk.cmdBindIndexBuffer(cmdBuffer, m_vertices.getIndexBuffer(), 0u, m_vertices.getIndexType());
				vk.cmdDrawIndexedIndirect(cmdBuffer, m_indirectBuffer, 0u, 1u, 0u);
				break;

			default:
				DE_ASSERT(0);
				break;
		}
		endRenderPass(vk, cmdBuffer);
	}